

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int need_nhdr_swap(short dim0,int hdrsize)

{
  if (dim0 == 0) {
    if (hdrsize != 0x15c) {
      if (hdrsize == 0x5c010000) {
        return 1;
      }
      if (g_opts_0 < 2) {
        return -2;
      }
      need_nhdr_swap_cold_2();
      return -2;
    }
  }
  else if (7 < (ushort)dim0) {
    if ((ushort)(dim0 << 8 | (ushort)dim0 >> 8) < 8) {
      return 1;
    }
    if (g_opts_0 < 2) {
      return -1;
    }
    need_nhdr_swap_cold_1();
    return -1;
  }
  return 0;
}

Assistant:

static int need_nhdr_swap( short dim0, int hdrsize )
{
   short d0    = dim0;     /* so we won't have to swap them on the stack */
   int   hsize = hdrsize;

   if( d0 != 0 ){     /* then use it for the check */
      if( d0 > 0 && d0 <= 7 ) return 0;

      nifti_swap_2bytes(1, &d0);        /* swap? */
      if( d0 > 0 && d0 <= 7 ) return 1;

      if( g_opts.debug > 1 ){
         fprintf(stderr,"** NIFTI: bad swapped d0 = %d, unswapped = ", d0);
         nifti_swap_2bytes(1, &d0);        /* swap? */
         fprintf(stderr,"%d\n", d0);
      }

      return -1;        /* bad, naughty d0 */
   }

   /* dim[0] == 0 should not happen, but could, so try hdrsize */
   if( hsize == sizeof(nifti_1_header) ) return 0;

   nifti_swap_4bytes(1, &hsize);     /* swap? */
   if( hsize == sizeof(nifti_1_header) ) return 1;

   if( g_opts.debug > 1 ){
      fprintf(stderr,"** NIFTI: bad swapped hsize = %d, unswapped = ", hsize);
      nifti_swap_4bytes(1, &hsize);        /* swap? */
      fprintf(stderr,"%d\n", hsize);
   }

   return -2;     /* bad, naughty hsize */
}